

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::mouseReleaseEvent(QTextEdit *this,QMouseEvent *e)

{
  byte bVar1;
  long lVar2;
  QWidgetTextControl *pQVar3;
  QWidgetData *pQVar4;
  QWidget *this_00;
  bool bVar5;
  char cVar6;
  bool bVar7;
  LayoutDirection LVar8;
  int iVar9;
  int iVar10;
  TextInteractionFlags TVar11;
  QStyle *pQVar12;
  long in_FS_OFFSET;
  double dVar13;
  double extraout_XMM1_Qa;
  double dVar14;
  undefined8 local_48;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar3 = *(QWidgetTextControl **)(lVar2 + 0x2f8);
  LVar8 = QWidget::layoutDirection(*(QWidget **)(lVar2 + 8));
  if (LVar8 == RightToLeft) {
    iVar9 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar2 + 0x288));
    iVar10 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
    iVar9 = iVar9 - iVar10;
  }
  else {
    iVar9 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
  }
  iVar10 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x290));
  local_40.yp = (qreal)iVar10;
  local_40.xp = (double)iVar9;
  QWidgetTextControl::processEvent(pQVar3,(QEvent *)e,&local_40,*(QWidget **)(lVar2 + 0x2b0));
  iVar9 = QMouseEvent::source();
  if ((iVar9 == 0) && (*(int *)(lVar2 + 0x308) != 0)) {
    QBasicTimer::stop();
    (**(code **)(**(long **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                       field_0x8 + 0x2f8) + 0x60))();
  }
  pQVar3 = *(QWidgetTextControl **)
            (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
            0x2f8);
  if (pQVar3 != (QWidgetTextControl *)0x0) {
    TVar11 = QWidgetTextControl::textInteractionFlags(pQVar3);
    if (((uint)TVar11.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
      pQVar4 = (this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
      local_40.yp = (qreal)CONCAT44((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i,
                                    (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i);
      local_40.xp = 0.0;
      dVar13 = (double)QEventPoint::position();
      dVar13 = (double)(((ulong)dVar13 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar13;
      bVar7 = 2147483647.0 < dVar13;
      if (dVar13 <= -2147483648.0) {
        dVar13 = -2147483648.0;
      }
      dVar14 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
               extraout_XMM1_Qa;
      bVar5 = 2147483647.0 < dVar14;
      if (dVar14 <= -2147483648.0) {
        dVar14 = -2147483648.0;
      }
      local_48 = CONCAT44((int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar5 & (ulong)dVar14),
                          (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar7 & (ulong)dVar13));
      cVar6 = QRect::contains((QPoint *)&local_40,SUB81(&local_48,0));
      if ((cVar6 != '\0') && (*(int *)(e + 0x40) == 1)) {
        bVar1 = *(byte *)(lVar2 + 800);
        this_00 = *(QWidget **)(lVar2 + 8);
        bVar7 = QApplication::autoSipEnabled(QCoreApplication::self);
        if (bVar7) {
          pQVar12 = QWidget::style(this_00);
          iVar9 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x5f,0,this_00,0);
          if (((bVar1 & 0x10) == 0) || (iVar9 == 1)) {
            QGuiApplication::inputMethod();
            QInputMethod::show();
          }
        }
      }
    }
  }
  *(byte *)(lVar2 + 800) = *(byte *)(lVar2 + 800) & 0xef;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->sendControlEvent(e);
    if (e->source() == Qt::MouseEventNotSynthesized && d->autoScrollTimer.isActive()) {
        d->autoScrollTimer.stop();
        ensureCursorVisible();
    }
    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}